

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseGetLasts(xmlParserCtxtPtr ctxt,xmlChar **lastlt,xmlChar **lastgt)

{
  xmlChar xVar1;
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  
  if (lastlt == (xmlChar **)0x0 || lastgt == (xmlChar **)0x0) {
    pp_Var2 = __xmlGenericError();
    UNRECOVERED_JUMPTABLE = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*UNRECOVERED_JUMPTABLE)(*ppvVar3,"Internal error: xmlParseGetLasts\n");
    return;
  }
  if ((ctxt->progressive != 0) && (ctxt->inputNr == 1)) {
    pxVar5 = ctxt->input->base;
    pxVar6 = ctxt->input->end + -1;
    do {
      pxVar4 = pxVar6;
      if (pxVar4 < pxVar5) goto LAB_0016ec0f;
      pxVar6 = pxVar4 + -1;
    } while (*pxVar4 != '<');
    if (pxVar5 <= pxVar4) {
      *lastlt = pxVar4;
      pxVar5 = ctxt->input->end;
      pxVar6 = pxVar4 + 1;
LAB_0016ec2c:
      if (pxVar6 < pxVar5) {
        xVar1 = *pxVar6;
        if (xVar1 == '\"') {
          do {
            pxVar7 = pxVar6 + 1;
            if (pxVar5 <= pxVar7) break;
            pxVar6 = pxVar7;
          } while (*pxVar7 != '\"');
        }
        else {
          if (xVar1 != '\'') {
            if (xVar1 == '>') {
              if (pxVar6 < pxVar5) {
                *lastgt = pxVar6;
                return;
              }
              goto LAB_0016ec92;
            }
            pxVar6 = pxVar6 + 1;
            goto LAB_0016ec2c;
          }
          do {
            pxVar7 = pxVar6 + 1;
            if (pxVar5 <= pxVar7) break;
            pxVar6 = pxVar7;
          } while (*pxVar7 != '\'');
        }
        pxVar6 = pxVar7 + 1;
        if (pxVar5 <= pxVar7) {
          pxVar6 = pxVar7;
        }
        goto LAB_0016ec2c;
      }
LAB_0016ec92:
      pxVar6 = ctxt->input->base;
      pxVar4 = pxVar4 + -1;
      do {
        pxVar5 = pxVar4;
        if (pxVar5 < pxVar6) goto LAB_0016ecab;
        pxVar4 = pxVar5 + -1;
      } while (*pxVar5 != '>');
      if (pxVar5 < pxVar6) {
LAB_0016ecab:
        *lastgt = (xmlChar *)0x0;
        return;
      }
      goto LAB_0016ec14;
    }
  }
LAB_0016ec0f:
  pxVar5 = (xmlChar *)0x0;
  *lastlt = (xmlChar *)0x0;
LAB_0016ec14:
  *lastgt = pxVar5;
  return;
}

Assistant:

static void
xmlParseGetLasts(xmlParserCtxtPtr ctxt, const xmlChar **lastlt,
                 const xmlChar **lastgt) {
    const xmlChar *tmp;

    if ((ctxt == NULL) || (lastlt == NULL) || (lastgt == NULL)) {
	xmlGenericError(xmlGenericErrorContext,
		    "Internal error: xmlParseGetLasts\n");
	return;
    }
    if ((ctxt->progressive != 0) && (ctxt->inputNr == 1)) {
        tmp = ctxt->input->end;
	tmp--;
	while ((tmp >= ctxt->input->base) && (*tmp != '<')) tmp--;
	if (tmp < ctxt->input->base) {
	    *lastlt = NULL;
	    *lastgt = NULL;
	} else {
	    *lastlt = tmp;
	    tmp++;
	    while ((tmp < ctxt->input->end) && (*tmp != '>')) {
	        if (*tmp == '\'') {
		    tmp++;
		    while ((tmp < ctxt->input->end) && (*tmp != '\'')) tmp++;
		    if (tmp < ctxt->input->end) tmp++;
		} else if (*tmp == '"') {
		    tmp++;
		    while ((tmp < ctxt->input->end) && (*tmp != '"')) tmp++;
		    if (tmp < ctxt->input->end) tmp++;
		} else
		    tmp++;
	    }
	    if (tmp < ctxt->input->end)
	        *lastgt = tmp;
	    else {
	        tmp = *lastlt;
		tmp--;
		while ((tmp >= ctxt->input->base) && (*tmp != '>')) tmp--;
		if (tmp >= ctxt->input->base)
		    *lastgt = tmp;
		else
		    *lastgt = NULL;
	    }
	}
    } else {
        *lastlt = NULL;
	*lastgt = NULL;
    }
}